

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
                *this)

{
  bool bVar1;
  
  bVar1 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::hasFastAccess(&this->left_->fadexpr_);
  if (bVar1) {
    bVar1 = FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>
            ::hasFastAccess(&this->right_->fadexpr_);
    return bVar1;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}